

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

void check_waitpid_and_exit(pid_t pid)

{
  __pid_t _Var1;
  ulong in_RAX;
  int status;
  undefined8 uStack_18;
  
  if (0 < pid) {
    uStack_18 = in_RAX;
    do {
      _Var1 = waitpid(pid,(int *)((long)&uStack_18 + 4),0);
    } while (_Var1 == -1);
    if (((uStack_18 & 0x7f00000000) == 0 && (uStack_18 & 0xff0000000000) != 0) ||
       (0x1ffffff < (int)((uStack_18._4_4_ & 0x7f) * 0x1000000 + 0x1000000))) {
      exit(1);
    }
  }
  exit(0);
}

Assistant:

void check_waitpid_and_exit(pid_t pid CK_ATTRIBUTE_UNUSED)
{
#if defined(HAVE_FORK) && HAVE_FORK==1
    pid_t pid_w;
    int status;

    if(pid > 0)
    {
        do
        {
            pid_w = waitpid(pid, &status, 0);
        }
        while(pid_w == -1);
        if(waserror(status, 0))
        {
            exit(EXIT_FAILURE);
        }
    }
    exit(EXIT_SUCCESS);
#else /* HAVE_FORK */
    /* Ignoring, as Check is not compiled with fork support. */
    exit(EXIT_FAILURE);
#endif /* HAVE_FORK */
}